

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

double __thiscall
ImPlot::PlotHistogram<short>
          (ImPlot *this,char *label_id,short *values,int count,int bins,bool cumulative,bool density
          ,ImPlotRange range,bool outliers,double bar_scale)

{
  short sVar1;
  double *pdVar2;
  ImPlotContext *pIVar3;
  short sVar4;
  int i;
  double *pdVar5;
  short sVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double local_88;
  GetterXsYs<double> local_50;
  
  dVar18 = range.Max;
  dVar19 = range.Min;
  uVar7 = (uint)values;
  if (count == 0 || (int)uVar7 < 1) {
    return 0.0;
  }
  uVar10 = (ulong)values & 0xffffffff;
  if ((((dVar19 == 0.0) && (!NAN(dVar19))) && (dVar18 == 0.0)) && (!NAN(dVar18))) {
    sVar4 = *(short *)label_id;
    sVar6 = sVar4;
    if (1 < uVar7) {
      uVar8 = 1;
      do {
        sVar1 = *(short *)(label_id + uVar8 * 2);
        if (sVar1 < sVar4) {
          sVar4 = sVar1;
        }
        if (sVar1 <= sVar6) {
          sVar1 = sVar6;
        }
        sVar6 = sVar1;
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
    dVar19 = (double)(int)sVar4;
    dVar18 = (double)(int)sVar6;
  }
  if (-1 < count) goto switchD_0023e816_default;
  switch(count) {
  case -4:
    dVar20 = (double)(int)uVar7;
    dVar16 = 0.0;
    uVar8 = 0;
    do {
      dVar16 = dVar16 + (double)(int)*(short *)(label_id + uVar8 * 2) * (1.0 / dVar20);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
    dVar17 = 0.0;
    uVar8 = 0;
    do {
      dVar17 = dVar17 + ((double)(int)*(short *)(label_id + uVar8 * 2) - dVar16) *
                        ((double)(int)*(short *)(label_id + uVar8 * 2) - dVar16) *
                        (1.0 / (dVar20 + -1.0));
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    dVar16 = cbrt(dVar20);
    dVar16 = round((dVar18 - dVar19) / ((dVar17 * 3.49) / dVar16));
    count = (int)dVar16;
    break;
  case -3:
    dVar16 = cbrt((double)(int)uVar7);
    dVar16 = dVar16 + dVar16;
    goto LAB_0023ed5f;
  case -2:
    dVar16 = log2((double)(int)uVar7);
    dVar16 = dVar16 + 1.0;
LAB_0023ed5f:
    dVar16 = ceil(dVar16);
    count = (int)dVar16;
    break;
  case -1:
    dVar16 = (double)(int)uVar7;
    if (dVar16 < 0.0) {
      dVar16 = sqrt(dVar16);
    }
    else {
      dVar16 = SQRT(dVar16);
    }
    dVar16 = ceil(dVar16);
    count = (int)dVar16;
  }
switchD_0023e816_default:
  pIVar3 = GImPlot;
  dVar16 = (dVar18 - dVar19) / (double)count;
  iVar11 = (GImPlot->Temp1).Capacity;
  if (iVar11 < count) {
    if (iVar11 == 0) {
      uVar9 = 8;
    }
    else {
      uVar9 = iVar11 / 2 + iVar11;
    }
    if ((int)uVar9 <= count) {
      uVar9 = count;
    }
    pdVar5 = (double *)ImGui::MemAlloc((long)(int)uVar9 << 3);
    pdVar2 = (pIVar3->Temp1).Data;
    if (pdVar2 != (double *)0x0) {
      memcpy(pdVar5,pdVar2,(long)(pIVar3->Temp1).Size << 3);
      ImGui::MemFree((pIVar3->Temp1).Data);
    }
    (pIVar3->Temp1).Data = pdVar5;
    (pIVar3->Temp1).Capacity = uVar9;
  }
  (pIVar3->Temp1).Size = count;
  iVar11 = (pIVar3->Temp2).Capacity;
  if (iVar11 < count) {
    if (iVar11 == 0) {
      uVar9 = 8;
    }
    else {
      uVar9 = iVar11 / 2 + iVar11;
    }
    if ((int)uVar9 <= count) {
      uVar9 = count;
    }
    pdVar5 = (double *)ImGui::MemAlloc((long)(int)uVar9 << 3);
    pdVar2 = (pIVar3->Temp2).Data;
    if (pdVar2 != (double *)0x0) {
      memcpy(pdVar5,pdVar2,(long)(pIVar3->Temp2).Size << 3);
      ImGui::MemFree((pIVar3->Temp2).Data);
    }
    (pIVar3->Temp2).Data = pdVar5;
    (pIVar3->Temp2).Capacity = uVar9;
  }
  (pIVar3->Temp2).Size = count;
  if (0 < count) {
    uVar8 = 0;
    do {
      if (((long)(pIVar3->Temp1).Size <= (long)uVar8) ||
         ((pIVar3->Temp1).Data[uVar8] = (double)(int)uVar8 * dVar16 + dVar19 + dVar16 * 0.5,
         (long)(pIVar3->Temp2).Size <= (long)uVar8)) goto LAB_0023ee05;
      (pIVar3->Temp2).Data[uVar8] = 0.0;
      uVar8 = uVar8 + 1;
    } while ((uint)count != uVar8);
  }
  local_88 = 0.0;
  uVar8 = 0;
  iVar11 = 0;
  uVar9 = 0;
  do {
    dVar20 = (double)(int)*(short *)(label_id + uVar8 * 2);
    if ((dVar20 < dVar19) || (dVar18 < dVar20)) {
      if (dVar20 < dVar19) {
        iVar11 = iVar11 + 1;
      }
    }
    else {
      uVar15 = (uint)((dVar20 - dVar19) / dVar16);
      uVar14 = uVar15;
      if ((int)(count - 1U) <= (int)uVar15) {
        uVar14 = count - 1U;
      }
      uVar13 = 0;
      if (-1 < (int)uVar15) {
        uVar13 = uVar14;
      }
      if (((int)uVar13 < 0) || ((pIVar3->Temp2).Size <= (int)uVar13)) goto LAB_0023ee05;
      pdVar2 = (pIVar3->Temp2).Data;
      dVar20 = pdVar2[uVar13] + 1.0;
      pdVar2[uVar13] = dVar20;
      if ((pIVar3->Temp2).Size <= (int)uVar13) goto LAB_0023ee05;
      if (dVar20 <= local_88) {
        dVar20 = local_88;
      }
      uVar9 = uVar9 + 1;
      local_88 = dVar20;
    }
    uVar8 = uVar8 + 1;
  } while (uVar10 != uVar8);
  if (((byte)bins & cumulative) != 0) {
    if (density) {
      if ((pIVar3->Temp2).Size < 1) goto LAB_0023ee05;
      pdVar2 = (pIVar3->Temp2).Data;
      *pdVar2 = (double)iVar11 + *pdVar2;
    }
    if (1 < count) {
      uVar10 = 1;
      do {
        lVar12 = (long)(pIVar3->Temp2).Size;
        if ((lVar12 < (long)uVar10) || (lVar12 <= (long)uVar10)) goto LAB_0023ee05;
        pdVar2 = (pIVar3->Temp2).Data;
        pdVar2[uVar10] = pdVar2[uVar10 - 1] + pdVar2[uVar10];
        uVar10 = uVar10 + 1;
      } while ((uint)count != uVar10);
    }
    if (density) {
      uVar9 = uVar7;
    }
    if (0 < count) {
      uVar10 = 0;
      do {
        if ((long)(pIVar3->Temp2).Size <= (long)uVar10) goto LAB_0023ee05;
        pdVar2 = (pIVar3->Temp2).Data;
        pdVar2[uVar10] = pdVar2[uVar10] * (1.0 / (double)(int)uVar9);
        uVar10 = uVar10 + 1;
      } while ((uint)count != uVar10);
      if ((0 < count) && (count <= (pIVar3->Temp2).Size)) {
        local_88 = (pIVar3->Temp2).Data[(ulong)(uint)count - 1];
        goto LAB_0023ecd2;
      }
    }
LAB_0023ee05:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                  ,0x68b,"T &ImVector<double>::operator[](int) [T = double]");
  }
  if ((byte)bins == 0) {
    if (cumulative) {
      if (density) {
        uVar9 = uVar7;
      }
      dVar19 = 1.0 / ((double)(int)uVar9 * dVar16);
      if (0 < count) {
        uVar10 = 0;
        do {
          if ((long)(pIVar3->Temp2).Size <= (long)uVar10) goto LAB_0023ee05;
          pdVar2 = (pIVar3->Temp2).Data;
          pdVar2[uVar10] = pdVar2[uVar10] * dVar19;
          uVar10 = uVar10 + 1;
        } while ((uint)count != uVar10);
      }
      local_88 = local_88 * dVar19;
    }
  }
  else {
    if (density) {
      if ((pIVar3->Temp2).Size < 1) goto LAB_0023ee05;
      pdVar2 = (pIVar3->Temp2).Data;
      *pdVar2 = (double)iVar11 + *pdVar2;
    }
    if (1 < count) {
      uVar10 = 1;
      do {
        lVar12 = (long)(pIVar3->Temp2).Size;
        if ((lVar12 < (long)uVar10) || (lVar12 <= (long)uVar10)) goto LAB_0023ee05;
        pdVar2 = (pIVar3->Temp2).Data;
        pdVar2[uVar10] = pdVar2[uVar10 - 1] + pdVar2[uVar10];
        uVar10 = uVar10 + 1;
      } while ((uint)count != uVar10);
    }
    if ((count < 1) || ((pIVar3->Temp2).Size < count)) goto LAB_0023ee05;
    local_88 = (pIVar3->Temp2).Data[(ulong)(uint)count - 1];
  }
LAB_0023ecd2:
  local_50.Xs = (pIVar3->Temp1).Data;
  local_50.Ys = (pIVar3->Temp2).Data;
  local_50.Offset = 0;
  local_50.Stride = 8;
  local_50.Count = count;
  PlotBarsEx<ImPlot::GetterXsYs<double>>((char *)this,&local_50,dVar16 * bar_scale);
  return local_88;
}

Assistant:

double PlotHistogram(const char* label_id, const T* values, int count, int bins, bool cumulative, bool density, ImPlotRange range, bool outliers, double bar_scale) {

    if (count <= 0 || bins == 0)
        return 0;

    if (range.Min == 0 && range.Max == 0) {
        T Min, Max;
        ImMinMaxArray(values, count, &Min, &Max);
        range.Min = (double)Min;
        range.Max = (double)Max;
    }

    double width;
    if (bins < 0)
        CalculateBins(values, count, bins, range, bins, width);
    else
        width = range.Size() / bins;

    ImVector<double>& bin_centers = GImPlot->Temp1;
    ImVector<double>& bin_counts  = GImPlot->Temp2;
    bin_centers.resize(bins);
    bin_counts.resize(bins);
    int below = 0;

    for (int b = 0; b < bins; ++b) {
        bin_centers[b] = range.Min + b * width + width * 0.5;
        bin_counts[b] = 0;
    }
    int counted = 0;
    double max_count = 0;
    for (int i = 0; i < count; ++i) {
        double val = (double)values[i];
        if (range.Contains(val)) {
            const int b = ImClamp((int)((val - range.Min) / width), 0, bins - 1);
            bin_counts[b] += 1.0;
            if (bin_counts[b] > max_count)
                max_count = bin_counts[b];
            counted++;
        }
        else if (val < range.Min) {
            below++;
        }
    }
    if (cumulative && density) {
        if (outliers)
            bin_counts[0] += below;
        for (int b = 1; b < bins; ++b)
            bin_counts[b] += bin_counts[b-1];
        double scale = 1.0 / (outliers ? count : counted);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count = bin_counts[bins-1];
    }
    else if (cumulative) {
        if (outliers)
            bin_counts[0] += below;
        for (int b = 1; b < bins; ++b)
            bin_counts[b] += bin_counts[b-1];
        max_count = bin_counts[bins-1];
    }
    else if (density) {
        double scale = 1.0 / ((outliers ? count : counted) * width);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count *= scale;
    }
    PlotBars(label_id, &bin_centers.Data[0], &bin_counts.Data[0], bins, bar_scale*width);
    return max_count;
}